

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O2

uchar * X509_keyid_get0(X509 *x,int *len)

{
  _func_257 *p_Var1;
  int iVar2;
  
  if (x->altname == (stack_st_GENERAL_NAME *)0x0) {
    p_Var1 = (_func_257 *)0x0;
    iVar2 = 0;
    if (len == (int *)0x0) {
      return (uchar *)0x0;
    }
  }
  else {
    p_Var1 = (x->altname->stack).comp;
    if (len == (int *)0x0) goto LAB_0041dc97;
    if (p_Var1 == (_func_257 *)0x0) {
      p_Var1 = (_func_257 *)0x0;
      iVar2 = 0;
    }
    else {
      iVar2 = *(int *)p_Var1;
    }
  }
  *len = iVar2;
LAB_0041dc97:
  if (p_Var1 != (_func_257 *)0x0) {
    return *(uchar **)(p_Var1 + 8);
  }
  return (uchar *)0x0;
}

Assistant:

const uint8_t *X509_keyid_get0(const X509 *x, int *out_len) {
  const ASN1_OCTET_STRING *keyid = x->aux != NULL ? x->aux->keyid : NULL;
  if (out_len != NULL) {
    *out_len = keyid != NULL ? keyid->length : 0;
  }
  return keyid != NULL ? keyid->data : NULL;
}